

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O1

void __thiscall Database::initIndex(Database *this)

{
  pointer pcVar1;
  IndexTree *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> index_filename;
  string local_38;
  
  pcVar1 = (this->file_prefix)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->file_prefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_38);
  this_00 = (IndexTree *)operator_new(0x38);
  IndexTree::IndexTree(this_00,&local_38);
  this->index = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Database::initIndex() {
    auto index_filename = file_prefix + ".index";
    index = new IndexTree(index_filename);
}